

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_array_suite.cpp
# Opt level: O1

void api_suite::api_lower_bound(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int *local_58;
  int *local_50;
  int local_48 [2];
  int aiStack_40 [6];
  int *local_28;
  int **local_20;
  int *local_18;
  
  local_20 = &local_28;
  aiStack_40[0] = 0;
  aiStack_40[1] = 0;
  aiStack_40[2] = 0;
  aiStack_40[3] = 0;
  aiStack_40[4] = 0;
  aiStack_40[5] = 0;
  local_58 = local_48;
  local_18 = aiStack_40;
  local_48[0] = 0xb;
  local_48[1] = 1;
  local_50 = local_18;
  if (local_58 != local_18) {
    lVar1 = (long)local_18 - (long)local_58 >> 3;
    local_50 = local_58;
    do {
      lVar2 = lVar1 >> 1;
      lVar3 = lVar2;
      if (9 < local_50[lVar2 * 2]) {
        lVar3 = 0;
      }
      local_50 = local_50 + lVar3 * 2;
      lVar1 = lVar1 - lVar2;
    } while (1 < lVar1);
    local_50 = local_50 + (ulong)(*local_50 < 10) * 2;
  }
  local_28 = local_58;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,vista::pair<int,int>*,vista::pair<int,int>*>
            ("array.lower_bound(10)","array.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x8d,"void api_suite::api_lower_bound()",&local_50,&local_58);
  local_50 = local_18;
  if (local_28 != local_18) {
    lVar1 = (long)local_18 - (long)local_28 >> 3;
    local_50 = local_28;
    do {
      lVar2 = lVar1 >> 1;
      lVar3 = lVar2;
      if (10 < local_50[lVar2 * 2]) {
        lVar3 = 0;
      }
      local_50 = local_50 + lVar3 * 2;
      lVar1 = lVar1 - lVar2;
    } while (1 < lVar1);
    local_50 = local_50 + (ulong)(*local_50 < 0xb) * 2;
  }
  local_58 = local_28;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,vista::pair<int,int>*,vista::pair<int,int>*>
            ("array.lower_bound(11)","array.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x8e,"void api_suite::api_lower_bound()",&local_50,&local_58);
  local_50 = local_18;
  if (local_28 != local_18) {
    lVar1 = (long)local_18 - (long)local_28 >> 3;
    local_50 = local_28;
    do {
      lVar2 = lVar1 >> 1;
      lVar3 = lVar2;
      if (0xb < local_50[lVar2 * 2]) {
        lVar3 = 0;
      }
      local_50 = local_50 + lVar3 * 2;
      lVar1 = lVar1 - lVar2;
    } while (1 < lVar1);
    local_50 = local_50 + (ulong)(*local_50 < 0xc) * 2;
  }
  local_58 = local_18;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,vista::pair<int,int>*,vista::pair<int,int>*>
            ("array.lower_bound(12)","array.end()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x8f,"void api_suite::api_lower_bound()",&local_50,&local_58);
  return;
}

Assistant:

void api_ctor_default()
{
    map_array<int, int, 4> array;
    BOOST_TEST_EQ(array.size(), 0);
    BOOST_TEST_EQ(array.capacity(), 4);
}